

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7e6f::ShadowedART::assertLowerBoundValid(ShadowedART *this,Key key)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  iterator iVar3;
  int line;
  char *expression;
  bool bVar4;
  art_iterator_t art_it;
  string local_f8;
  key_type local_d8;
  _Rb_tree_color local_d0;
  short local_cc;
  art_iterator_t local_c8;
  string local_40;
  
  local_d8.key_._M_elems._0_4_ = key.key_._M_elems._0_4_;
  local_d8.key_._M_elems._4_2_ = key.key_._M_elems._4_2_;
  iVar3 = std::
          map<(anonymous_namespace)::Key,_(anonymous_namespace)::Value,_std::less<(anonymous_namespace)::Key>,_std::allocator<std::pair<const_(anonymous_namespace)::Key,_(anonymous_namespace)::Value>_>_>
          ::lower_bound(&this->shadow_,&local_d8);
  art_lower_bound(&local_c8,(art_t *)&this->art_,(art_key_chunk_t *)&local_d8);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->shadow_)._M_t._M_impl.super__Rb_tree_header) {
    if (local_c8.value == (art_val_t *)0x0) {
      return;
    }
    puts("Iterator is not null");
    bVar4 = local_c8.value == (art_val_t *)0x0;
    expression = "art_it->value == nullptr";
    line = 0x94;
  }
  else {
    if (local_c8.value == (art_val_t *)0x0) {
      (anonymous_namespace)::Key::string_abi_cxx11_(&local_f8,iVar3._M_node + 1);
      printf("Iterator for key %s is null\n",
             CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                      CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                               (_Rb_tree_color)local_f8._M_dataplus._M_p)));
      puVar1 = (undefined1 *)
               CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                        CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                                 (_Rb_tree_color)local_f8._M_dataplus._M_p));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar1 != &local_f8.field_2) {
        operator_delete(puVar1);
      }
      _assert_true((ulong)(local_c8.value != (art_val_t *)0x0),"art_it->value != nullptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
                   ,0x90);
    }
    local_f8._M_dataplus._M_p._4_1_ = local_c8.key[4];
    local_f8._M_dataplus._M_p._5_1_ = local_c8.key[5];
    local_f8._M_dataplus._M_p._0_1_ = local_c8.key[0];
    local_f8._M_dataplus._M_p._1_1_ = local_c8.key[1];
    local_f8._M_dataplus._M_p._2_1_ = local_c8.key[2];
    local_f8._M_dataplus._M_p._3_1_ = local_c8.key[3];
    if (local_c8.key._4_2_ == *(short *)&iVar3._M_node[1].field_0x4 &&
        local_c8.key._0_4_ == iVar3._M_node[1]._M_color) {
      return;
    }
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_f8,iVar3._M_node + 1);
    uVar2 = CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                     CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                              (_Rb_tree_color)local_f8._M_dataplus._M_p));
    local_cc._0_1_ = local_c8.key[4];
    local_cc._1_1_ = local_c8.key[5];
    local_d0._0_1_ = local_c8.key[0];
    local_d0._1_1_ = local_c8.key[1];
    local_d0._2_1_ = local_c8.key[2];
    local_d0._3_1_ = local_c8.key[3];
    (anonymous_namespace)::Key::string_abi_cxx11_(&local_40,&local_d0);
    printf("Shadow iterator key = %s, ART key = %s\n",uVar2,local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    puVar1 = (undefined1 *)
             CONCAT26(local_f8._M_dataplus._M_p._6_2_,
                      CONCAT24(local_f8._M_dataplus._M_p._4_2_,
                               (_Rb_tree_color)local_f8._M_dataplus._M_p));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar1 != &local_f8.field_2) {
      operator_delete(puVar1);
    }
    local_f8._M_dataplus._M_p._4_1_ = local_c8.key[4];
    local_f8._M_dataplus._M_p._5_1_ = local_c8.key[5];
    local_f8._M_dataplus._M_p._0_1_ = local_c8.key[0];
    local_f8._M_dataplus._M_p._1_1_ = local_c8.key[1];
    local_f8._M_dataplus._M_p._2_1_ = local_c8.key[2];
    local_f8._M_dataplus._M_p._3_1_ = local_c8.key[3];
    bVar4 = local_c8.key._4_2_ == *(short *)&iVar3._M_node[1].field_0x4 &&
            local_c8.key._0_4_ == iVar3._M_node[1]._M_color;
    expression = "shadow_it->first == Key(art_it->key)";
    line = 0x9b;
  }
  _assert_true((ulong)bVar4,expression,
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,line);
  return;
}

Assistant:

void assertLowerBoundValid(Key key) {
        auto shadow_it = shadow_.lower_bound(key);
        auto art_it = art_lower_bound(&art_, key.data());
        assertIteratorValid(shadow_it, &art_it);
    }